

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_io.c
# Opt level: O1

int lj_cf_io_method_seek(lua_State *L)

{
  TValue *pTVar1;
  uint uVar2;
  FILE *__stream;
  int iVar3;
  IOFileUD *pIVar4;
  __off64_t _Var5;
  
  pIVar4 = io_tofile(L);
  __stream = (FILE *)pIVar4->fp;
  iVar3 = lj_lib_checkopt(L,2,1,"\x03set\x03cur\x03end");
  pTVar1 = L->base + 2;
  if (pTVar1 < L->top) {
    uVar2 = *(uint *)((long)L->base + 0x14);
    if (uVar2 < 0xfffeffff) {
      _Var5 = (__off64_t)pTVar1->n;
      goto LAB_001474bd;
    }
    if (uVar2 != 0xffffffff) {
      lj_err_argt(L,3,3);
    }
  }
  _Var5 = 0;
LAB_001474bd:
  iVar3 = fseeko64(__stream,_Var5,iVar3);
  if (iVar3 != 0) {
    iVar3 = luaL_fileresult(L,0,(char *)0x0);
    return iVar3;
  }
  _Var5 = ftello64(__stream);
  L->top[-1].n = (double)_Var5;
  return 1;
}

Assistant:

LJLIB_CF(io_method_seek)
{
  FILE *fp = io_tofile(L)->fp;
  int opt = lj_lib_checkopt(L, 2, 1, "\3set\3cur\3end");
  int64_t ofs = 0;
  cTValue *o;
  int res;
  if (opt == 0) opt = SEEK_SET;
  else if (opt == 1) opt = SEEK_CUR;
  else if (opt == 2) opt = SEEK_END;
  o = L->base+2;
  if (o < L->top) {
    if (tvisint(o))
      ofs = (int64_t)intV(o);
    else if (tvisnum(o))
      ofs = (int64_t)numV(o);
    else if (!tvisnil(o))
      lj_err_argt(L, 3, LUA_TNUMBER);
  }
#if LJ_TARGET_POSIX
  res = fseeko(fp, ofs, opt);
#elif _MSC_VER >= 1400
  res = _fseeki64(fp, ofs, opt);
#elif defined(__MINGW32__)
  res = fseeko64(fp, ofs, opt);
#else
  res = fseek(fp, (long)ofs, opt);
#endif
  if (res)
    return luaL_fileresult(L, 0, NULL);
#if LJ_TARGET_POSIX
  ofs = ftello(fp);
#elif _MSC_VER >= 1400
  ofs = _ftelli64(fp);
#elif defined(__MINGW32__)
  ofs = ftello64(fp);
#else
  ofs = (int64_t)ftell(fp);
#endif
  setint64V(L->top-1, ofs);
  return 1;
}